

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O2

string * __thiscall
BmsParseTooManyObjectException::Message_abi_cxx11_
          (string *__return_storage_ptr__,BmsParseTooManyObjectException *this)

{
  stringstream os;
  stringstream local_190 [16];
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::operator<<(local_180,"Too many object/note exists.");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string
BmsParseTooManyObjectException::Message( void ) const
{
  std::stringstream os;
  os << "Too many object/note exists.";
  return os.str();
}